

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_platform.cpp
# Opt level: O0

bool lzham_is_debugger_present(void)

{
  return false;
}

Assistant:

bool lzham_is_debugger_present(void)
{
#if LZHAM_PLATFORM_X360
   return DmIsDebuggerPresent() != 0;
#elif LZHAM_USE_WIN32_API
   return IsDebuggerPresent() != 0;
#elif LZHAM_FORCE_DEBUGGER_PRESENT
   return true;
#else
   return false;
#endif
}